

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParser.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::SAXParser::endElement
          (SAXParser *this,XMLElementDecl *elemDecl,uint uriId,bool isRoot,XMLCh *elemPrefix)

{
  XMLBuffer *this_00;
  XMLSize_t XVar1;
  XMLCh *pXVar2;
  long lVar3;
  DocumentHandler *pDVar4;
  ulong uVar5;
  
  pDVar4 = this->fDocHandler;
  if (pDVar4 != (DocumentHandler *)0x0) {
    if (this->fScanner->fDoNamespaces == true) {
      if ((elemPrefix == (XMLCh *)0x0) || (*elemPrefix == L'\0')) {
        pXVar2 = elemDecl->fElementName->fLocalPart;
        lVar3 = *(long *)pDVar4;
      }
      else {
        this_00 = &this->fElemQNameBuf;
        (this->fElemQNameBuf).fIndex = 0;
        XMLBuffer::append(this_00,elemPrefix);
        XVar1 = (this->fElemQNameBuf).fIndex;
        if (XVar1 == (this->fElemQNameBuf).fCapacity) {
          XMLBuffer::ensureCapacity(this_00,1);
          XVar1 = this_00->fIndex;
        }
        (this->fElemQNameBuf).fIndex = XVar1 + 1;
        (this->fElemQNameBuf).fBuffer[XVar1] = L':';
        XMLBuffer::append(this_00,elemDecl->fElementName->fLocalPart);
        pXVar2 = (this->fElemQNameBuf).fBuffer;
        pDVar4 = this->fDocHandler;
        pXVar2[(this->fElemQNameBuf).fIndex] = L'\0';
        lVar3 = *(long *)pDVar4;
      }
      (**(code **)(lVar3 + 0x20))(pDVar4,pXVar2);
    }
    else {
      pXVar2 = QName::getRawName(elemDecl->fElementName);
      (**(code **)(*(long *)pDVar4 + 0x20))(pDVar4,pXVar2);
    }
  }
  if (this->fAdvDHCount != 0) {
    uVar5 = 0;
    do {
      (*this->fAdvDHList[uVar5]->_vptr_XMLDocumentHandler[6])
                (this->fAdvDHList[uVar5],elemDecl,(ulong)uriId,(ulong)isRoot,elemPrefix);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->fAdvDHCount);
  }
  if (this->fElemDepth != 0) {
    this->fElemDepth = this->fElemDepth - 1;
  }
  return;
}

Assistant:

void SAXParser::endElement( const   XMLElementDecl& elemDecl
                            , const unsigned int    uriId
                            , const bool            isRoot
                            , const XMLCh* const    elemPrefix)
{
    // Just map to the SAX document handler
    if (fDocHandler) {
        if (fScanner->getDoNamespaces()) {

            if (elemPrefix && *elemPrefix) {

                fElemQNameBuf.set(elemPrefix);
                fElemQNameBuf.append(chColon);
                fElemQNameBuf.append(elemDecl.getBaseName());
                fDocHandler->endElement(fElemQNameBuf.getRawBuffer());
            }
            else {
                fDocHandler->endElement(elemDecl.getBaseName());
            }
        }
        else
            fDocHandler->endElement(elemDecl.getFullName());

    }

    //
    //  If there are any installed advanced handlers, then lets call them
    //  with this info.
    //
    for (XMLSize_t index = 0; index < fAdvDHCount; index++)
        fAdvDHList[index]->endElement(elemDecl, uriId, isRoot, elemPrefix);

    //
    //  Dump the element depth down again. Don't let it underflow in case
    //  of malformed XML.
    //
    if (fElemDepth)
        fElemDepth--;
}